

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_many_nulls.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  QPDFWriter local_198 [8];
  QPDFWriter w;
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [32];
  QPDFObjectHandle local_138;
  QPDFObjectHandle local_128;
  QPDFObjectHandle local_118;
  QPDFObjectHandle local_108;
  QPDFObjectHandle local_f8;
  undefined1 local_e8 [8];
  QPDFObjectHandle page;
  QPDFObjectHandle local_c8;
  allocator<char> local_b1;
  string local_b0 [32];
  QPDFObjectHandle local_90;
  int local_7c;
  undefined1 local_78 [4];
  int j;
  QPDFObjectHandle inner;
  undefined1 local_60 [4];
  int i;
  QPDFObjectHandle top;
  QPDFObjectHandle null;
  QPDF local_30 [8];
  QPDF q;
  char *outfile;
  char *whoami;
  char **argv_local;
  int argc_local;
  
  pcVar1 = (char *)QUtil::getWhoami(*argv);
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,pcVar1);
    poVar2 = std::operator<<(poVar2," outfile.pdf");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  _q = argv[1];
  QPDF::QPDF(local_30);
  QPDF::emptyPDF();
  QPDFObjectHandle::newNull();
  operator____qpdf(local_60,0x104019);
  for (inner.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._4_4_ = 0;
      inner.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ < 0x14;
      inner.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ =
           inner.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ + 1) {
    operator____qpdf(local_78,0x104019);
    for (local_7c = 0; local_7c < 20000; local_7c = local_7c + 1) {
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_78);
    }
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_60);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  }
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"/Nulls",&local_b1);
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_60);
  QPDF::makeIndirectObject((QPDFObjectHandle *)&local_c8);
  QPDFObjectHandle::replaceKey((string *)&local_90,(QPDFObjectHandle *)local_b0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c8);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_90);
  operator____qpdf(local_e8,0x104023);
  QPDFObjectHandle::QPDFObjectHandle(&local_108,(QPDFObjectHandle *)local_e8);
  QPDF::makeIndirectObject((QPDFObjectHandle *)&local_f8);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_e8,&local_f8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_108);
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"/Pages",&local_159);
  QPDFObjectHandle::getKey((string *)&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"/Kids",&local_181);
  QPDFObjectHandle::getKey((string *)&local_118);
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)&local_118);
  QPDFObjectHandle::~QPDFObjectHandle(&local_118);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  QPDFObjectHandle::~QPDFObjectHandle(&local_128);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  QPDFObjectHandle::~QPDFObjectHandle(&local_138);
  QPDFWriter::QPDFWriter(local_198,local_30,_q);
  QPDFWriter::setObjectStreamMode((qpdf_object_stream_e)local_198);
  QPDFWriter::setDeterministicID(SUB81(local_198,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_198);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_60);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &top.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDF::~QPDF(local_30);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    auto whoami = QUtil::getWhoami(argv[0]);
    if (argc != 2) {
        std::cerr << "Usage: " << whoami << " outfile.pdf" << std::endl;
        exit(2);
    }
    char const* outfile = argv[1];

    // Create a file with lots of arrays containing very large numbers
    // of nulls. Prior to qpdf 9.0.0, qpdf had a lot of trouble with
    // this kind of file. This program is used to generate a file that
    // can be used in the test suite and performance benchmarking.
    QPDF q;
    q.emptyPDF();
    auto null = QPDFObjectHandle::newNull();
    auto top = "[]"_qpdf;
    for (int i = 0; i < 20; ++i) {
        auto inner = "[]"_qpdf;
        for (int j = 0; j < 20000; ++j) {
            inner.appendItem(null);
        }
        top.appendItem(inner);
    }
    q.getTrailer().replaceKey("/Nulls", q.makeIndirectObject(top));
    auto page = "<< /Type /Page /MediaBox [0 0 612 792] >>"_qpdf;
    page = q.makeIndirectObject(page);
    q.getRoot().getKey("/Pages").getKey("/Kids").appendItem(page);
    QPDFWriter w(q, outfile);
    w.setObjectStreamMode(qpdf_o_generate);
    w.setDeterministicID(true);
    w.write();
    return 0;
}